

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

ON_RTreeBBox *
CombineRectHelper(ON_RTreeBBox *__return_storage_ptr__,ON_RTreeBBox *a_rectA,ON_RTreeBBox *a_rectB)

{
  ON_RTreeBBox *rect;
  ON_RTreeBBox *a_rectB_local;
  ON_RTreeBBox *a_rectA_local;
  
  memcpy(__return_storage_ptr__,a_rectA,0x30);
  if (a_rectB->m_min[0] <= __return_storage_ptr__->m_min[0] &&
      __return_storage_ptr__->m_min[0] != a_rectB->m_min[0]) {
    __return_storage_ptr__->m_min[0] = a_rectB->m_min[0];
  }
  if (a_rectB->m_min[1] <= __return_storage_ptr__->m_min[1] &&
      __return_storage_ptr__->m_min[1] != a_rectB->m_min[1]) {
    __return_storage_ptr__->m_min[1] = a_rectB->m_min[1];
  }
  if (a_rectB->m_min[2] <= __return_storage_ptr__->m_min[2] &&
      __return_storage_ptr__->m_min[2] != a_rectB->m_min[2]) {
    __return_storage_ptr__->m_min[2] = a_rectB->m_min[2];
  }
  if (__return_storage_ptr__->m_max[0] < a_rectB->m_max[0]) {
    __return_storage_ptr__->m_max[0] = a_rectB->m_max[0];
  }
  if (__return_storage_ptr__->m_max[1] < a_rectB->m_max[1]) {
    __return_storage_ptr__->m_max[1] = a_rectB->m_max[1];
  }
  if (__return_storage_ptr__->m_max[2] < a_rectB->m_max[2]) {
    __return_storage_ptr__->m_max[2] = a_rectB->m_max[2];
  }
  return __return_storage_ptr__;
}

Assistant:

ON_RTreeBBox CombineRectHelper(const ON_RTreeBBox* a_rectA, const ON_RTreeBBox* a_rectB)
{
  ON_RTreeBBox rect = *a_rectA;

#if (3 == ON_RTree_NODE_DIM)
  if ( rect.m_min[0] > a_rectB->m_min[0] )
    rect.m_min[0] = a_rectB->m_min[0];
  if ( rect.m_min[1] > a_rectB->m_min[1] )
    rect.m_min[1] = a_rectB->m_min[1];
  if ( rect.m_min[2] > a_rectB->m_min[2] )
    rect.m_min[2] = a_rectB->m_min[2];
  if ( rect.m_max[0] < a_rectB->m_max[0] )
    rect.m_max[0] = a_rectB->m_max[0];
  if ( rect.m_max[1] < a_rectB->m_max[1] )
    rect.m_max[1] = a_rectB->m_max[1];
  if ( rect.m_max[2] < a_rectB->m_max[2] )
    rect.m_max[2] = a_rectB->m_max[2];
#else
  for( int j = 0; j < ON_RTree_NODE_DIM; j++ )
  {
    if ( rect.m_min[j] > a_rectB->m_min[j] )
      rect.m_min[j] = a_rectB->m_min[j];
    if ( rect.m_max[j] < a_rectB->m_max[j] )
      rect.m_max[j] = a_rectB->m_max[j];
  }
#endif

  return rect;
}